

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration_test.cc
# Opt level: O0

Response * __thiscall
prometheus::anon_unknown_0::IntegrationTest::FetchMetrics
          (Response *__return_storage_ptr__,IntegrationTest *this,string *metrics_path)

{
  bool bVar1;
  void *__p;
  runtime_error *prVar2;
  element_type *peVar3;
  undefined8 uVar4;
  char *local_70;
  char *ct;
  CURLcode curl_error;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> url;
  undefined1 local_30 [8];
  shared_ptr<void> curl;
  string *metrics_path_local;
  IntegrationTest *this_local;
  Response *response;
  
  curl.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)metrics_path;
  __p = (void *)curl_easy_init();
  std::shared_ptr<void>::shared_ptr<void,void(*)(void*),void>
            ((shared_ptr<void> *)local_30,__p,curl_easy_cleanup);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
  if (!bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"failed to initialize libcurl");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&curl_error,
                 &this->base_url_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 curl.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  ct._7_1_ = 0;
  Response::Response(__return_storage_ptr__);
  peVar3 = std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *)local_30);
  uVar4 = std::__cxx11::string::c_str();
  curl_easy_setopt(peVar3,0x2712,uVar4);
  peVar3 = std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *)local_30);
  curl_easy_setopt(peVar3,0x2711,&__return_storage_ptr__->body);
  peVar3 = std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *)local_30);
  curl_easy_setopt(peVar3,0x4e2b,WriteCallback);
  bVar1 = std::function::operator_cast_to_bool((function *)&this->fetchPrePerform_);
  if (bVar1) {
    peVar3 = std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *)local_30);
    std::function<void_(void_*)>::operator()(&this->fetchPrePerform_,peVar3);
  }
  peVar3 = std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *)local_30);
  ct._0_4_ = curl_easy_perform(peVar3);
  if ((int)ct != 0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"failed to perform HTTP request");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  peVar3 = std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *)local_30);
  curl_easy_getinfo(peVar3,0x200002,__return_storage_ptr__);
  local_70 = (char *)0x0;
  peVar3 = std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *)local_30);
  curl_easy_getinfo(peVar3,0x100012,&local_70);
  if (local_70 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->contentType,local_70);
  }
  ct._7_1_ = 1;
  std::__cxx11::string::~string((string *)&curl_error);
  std::shared_ptr<void>::~shared_ptr((shared_ptr<void> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

Response FetchMetrics(const std::string& metrics_path) const {
    auto curl = std::shared_ptr<CURL>(curl_easy_init(), curl_easy_cleanup);
    if (!curl) {
      throw std::runtime_error("failed to initialize libcurl");
    }

    const auto url = base_url_ + metrics_path;
    Response response;

    curl_easy_setopt(curl.get(), CURLOPT_URL, url.c_str());
    curl_easy_setopt(curl.get(), CURLOPT_WRITEDATA, &response.body);
    curl_easy_setopt(curl.get(), CURLOPT_WRITEFUNCTION, WriteCallback);

    if (fetchPrePerform_) {
      fetchPrePerform_(curl.get());
    }

    CURLcode curl_error = curl_easy_perform(curl.get());
    if (curl_error != CURLE_OK) {
      throw std::runtime_error("failed to perform HTTP request");
    }

    curl_easy_getinfo(curl.get(), CURLINFO_RESPONSE_CODE, &response.code);

    char* ct = nullptr;
    curl_easy_getinfo(curl.get(), CURLINFO_CONTENT_TYPE, &ct);
    if (ct) {
      response.contentType = ct;
    }

    return response;
  }